

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O1

void google::protobuf::TestUtilLite::ModifyPackedFields(TestPackedTypesLite *message)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<unsigned_int> *pRVar2;
  RepeatedField<unsigned_long> *pRVar3;
  RepeatedField<int> *pRVar4;
  RepeatedField<float> *this;
  RepeatedField<double> *this_00;
  RepeatedField<bool> *this_01;
  bool bVar5;
  int iVar6;
  int *piVar7;
  long *plVar8;
  uint *puVar9;
  unsigned_long *puVar10;
  float *pfVar11;
  double *pdVar12;
  bool *pbVar13;
  Nonnull<const_char_*> pcVar14;
  
  iVar6 = internal::SooRep::size
                    ((SooRep *)&(message->field_0)._impl_,
                     (undefined1  [280])
                     ((undefined1  [280])message->field_0 & (undefined1  [280])0x4) ==
                     (undefined1  [280])0x0);
  if (iVar6 < 2) {
    pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                        (1,(long)iVar6,"index < size()");
  }
  else {
    pcVar14 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar14 == (Nonnull<const_char_*>)0x0) {
    piVar7 = RepeatedField<int>::elements
                       (&(message->field_0)._impl_.packed_int32_,
                        (undefined1  [280])
                        ((undefined1  [280])message->field_0 & (undefined1  [280])0x4) ==
                        (undefined1  [280])0x0);
    piVar7[1] = 0x321;
    pRVar1 = &(message->field_0)._impl_.packed_int64_;
    iVar6 = internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&message->field_0 + 0x18) & 4) == 0);
    if (iVar6 < 2) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (1,(long)iVar6,"index < size()");
    }
    else {
      pcVar14 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar14 != (Nonnull<const_char_*>)0x0) goto LAB_001a724c;
    plVar8 = RepeatedField<long>::elements
                       (pRVar1,(*(byte *)((long)&message->field_0 + 0x18) & 4) == 0);
    plVar8[1] = 0x322;
    pRVar2 = &(message->field_0)._impl_.packed_uint32_;
    iVar6 = internal::SooRep::size
                      (&pRVar2->soo_rep_,(*(byte *)((long)&message->field_0 + 0x30) & 4) == 0);
    if (iVar6 < 2) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (1,(long)iVar6,"index < size()");
    }
    else {
      pcVar14 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar14 != (Nonnull<const_char_*>)0x0) goto LAB_001a7259;
    puVar9 = RepeatedField<unsigned_int>::elements
                       (pRVar2,(*(byte *)((long)&message->field_0 + 0x30) & 4) == 0);
    puVar9[1] = 0x323;
    pRVar3 = &(message->field_0)._impl_.packed_uint64_;
    iVar6 = internal::SooRep::size
                      (&pRVar3->soo_rep_,(*(byte *)((long)&message->field_0 + 0x48) & 4) == 0);
    if (iVar6 < 2) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (1,(long)iVar6,"index < size()");
    }
    else {
      pcVar14 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar14 != (Nonnull<const_char_*>)0x0) goto LAB_001a7266;
    puVar10 = RepeatedField<unsigned_long>::elements
                        (pRVar3,(*(byte *)((long)&message->field_0 + 0x48) & 4) == 0);
    puVar10[1] = 0x324;
    pRVar4 = &(message->field_0)._impl_.packed_sint32_;
    iVar6 = internal::SooRep::size
                      (&pRVar4->soo_rep_,(*(byte *)((long)&message->field_0 + 0x60) & 4) == 0);
    if (iVar6 < 2) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (1,(long)iVar6,"index < size()");
    }
    else {
      pcVar14 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar14 != (Nonnull<const_char_*>)0x0) goto LAB_001a7273;
    piVar7 = RepeatedField<int>::elements
                       (pRVar4,(*(byte *)((long)&message->field_0 + 0x60) & 4) == 0);
    piVar7[1] = 0x325;
    pRVar1 = &(message->field_0)._impl_.packed_sint64_;
    iVar6 = internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&message->field_0 + 0x78) & 4) == 0);
    if (iVar6 < 2) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (1,(long)iVar6,"index < size()");
    }
    else {
      pcVar14 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar14 != (Nonnull<const_char_*>)0x0) goto LAB_001a7280;
    plVar8 = RepeatedField<long>::elements
                       (pRVar1,(*(byte *)((long)&message->field_0 + 0x78) & 4) == 0);
    plVar8[1] = 0x326;
    pRVar2 = &(message->field_0)._impl_.packed_fixed32_;
    iVar6 = internal::SooRep::size
                      (&pRVar2->soo_rep_,(*(byte *)((long)&message->field_0 + 0x90) & 4) == 0);
    if (iVar6 < 2) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (1,(long)iVar6,"index < size()");
    }
    else {
      pcVar14 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar14 != (Nonnull<const_char_*>)0x0) goto LAB_001a728d;
    puVar9 = RepeatedField<unsigned_int>::elements
                       (pRVar2,(*(byte *)((long)&message->field_0 + 0x90) & 4) == 0);
    puVar9[1] = 0x327;
    pRVar3 = &(message->field_0)._impl_.packed_fixed64_;
    iVar6 = internal::SooRep::size
                      (&pRVar3->soo_rep_,(*(byte *)((long)&message->field_0 + 0xa0) & 4) == 0);
    if (iVar6 < 2) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (1,(long)iVar6,"index < size()");
    }
    else {
      pcVar14 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar14 != (Nonnull<const_char_*>)0x0) goto LAB_001a729a;
    puVar10 = RepeatedField<unsigned_long>::elements
                        (pRVar3,(*(byte *)((long)&message->field_0 + 0xa0) & 4) == 0);
    puVar10[1] = 0x328;
    pRVar4 = &(message->field_0)._impl_.packed_sfixed32_;
    iVar6 = internal::SooRep::size
                      (&pRVar4->soo_rep_,(*(byte *)((long)&message->field_0 + 0xb0) & 4) == 0);
    if (iVar6 < 2) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (1,(long)iVar6,"index < size()");
    }
    else {
      pcVar14 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar14 != (Nonnull<const_char_*>)0x0) goto LAB_001a72a7;
    piVar7 = RepeatedField<int>::elements
                       (pRVar4,(*(byte *)((long)&message->field_0 + 0xb0) & 4) == 0);
    piVar7[1] = 0x329;
    pRVar1 = &(message->field_0)._impl_.packed_sfixed64_;
    iVar6 = internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&message->field_0 + 0xc0) & 4) == 0);
    if (iVar6 < 2) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (1,(long)iVar6,"index < size()");
    }
    else {
      pcVar14 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar14 != (Nonnull<const_char_*>)0x0) goto LAB_001a72b4;
    plVar8 = RepeatedField<long>::elements
                       (pRVar1,(*(byte *)((long)&message->field_0 + 0xc0) & 4) == 0);
    plVar8[1] = 0x32a;
    this = &(message->field_0)._impl_.packed_float_;
    iVar6 = internal::SooRep::size
                      (&this->soo_rep_,(*(byte *)((long)&message->field_0 + 0xd0) & 4) == 0);
    if (iVar6 < 2) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (1,(long)iVar6,"index < size()");
    }
    else {
      pcVar14 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar14 != (Nonnull<const_char_*>)0x0) goto LAB_001a72c1;
    pfVar11 = RepeatedField<float>::elements
                        (this,(*(byte *)((long)&message->field_0 + 0xd0) & 4) == 0);
    pfVar11[1] = 811.0;
    this_00 = &(message->field_0)._impl_.packed_double_;
    iVar6 = internal::SooRep::size
                      (&this_00->soo_rep_,(*(byte *)((long)&message->field_0 + 0xe0) & 4) == 0);
    if (iVar6 < 2) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (1,(long)iVar6,"index < size()");
    }
    else {
      pcVar14 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar14 != (Nonnull<const_char_*>)0x0) goto LAB_001a72ce;
    pdVar12 = RepeatedField<double>::elements
                        (this_00,(*(byte *)((long)&message->field_0 + 0xe0) & 4) == 0);
    pdVar12[1] = 812.0;
    this_01 = &(message->field_0)._impl_.packed_bool_;
    iVar6 = internal::SooRep::size
                      (&this_01->soo_rep_,(*(byte *)((long)&message->field_0 + 0xf0) & 4) == 0);
    if (iVar6 < 2) {
      pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          (1,(long)iVar6,"index < size()");
    }
    else {
      pcVar14 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar14 == (Nonnull<const_char_*>)0x0) {
      pbVar13 = RepeatedField<bool>::elements
                          (this_01,(undefined1  [16])
                                   ((undefined1  [16])(this_01->soo_rep_).field_0 &
                                   (undefined1  [16])0x4) == (undefined1  [16])0x0);
      pbVar13[1] = true;
      bVar5 = internal::ValidateEnum(4,(uint32_t *)&proto2_unittest::ForeignEnumLite_internal_data_)
      ;
      if (bVar5) {
        pRVar4 = &(message->field_0)._impl_.packed_enum_;
        iVar6 = internal::SooRep::size
                          (&pRVar4->soo_rep_,(*(byte *)((long)&message->field_0 + 0x100) & 4) == 0);
        if (iVar6 < 2) {
          pcVar14 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (1,(long)iVar6,"index < size()");
        }
        else {
          pcVar14 = (Nonnull<const_char_*>)0x0;
        }
        if (pcVar14 == (Nonnull<const_char_*>)0x0) {
          piVar7 = RepeatedField<int>::elements
                             (pRVar4,(undefined1  [16])
                                     ((undefined1  [16])(pRVar4->soo_rep_).field_0 &
                                     (undefined1  [16])0x4) == (undefined1  [16])0x0);
          piVar7[1] = 4;
          return;
        }
        ModifyPackedFields();
      }
      goto LAB_001a72e8;
    }
  }
  else {
    ModifyPackedFields();
LAB_001a724c:
    ModifyPackedFields();
LAB_001a7259:
    ModifyPackedFields();
LAB_001a7266:
    ModifyPackedFields();
LAB_001a7273:
    ModifyPackedFields();
LAB_001a7280:
    ModifyPackedFields();
LAB_001a728d:
    ModifyPackedFields();
LAB_001a729a:
    ModifyPackedFields();
LAB_001a72a7:
    ModifyPackedFields();
LAB_001a72b4:
    ModifyPackedFields();
LAB_001a72c1:
    ModifyPackedFields();
LAB_001a72ce:
    ModifyPackedFields();
  }
  ModifyPackedFields();
LAB_001a72e8:
  __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::proto2_unittest::ForeignEnumLite_internal_data_)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_lite.pb.h"
                ,0x3bb5,
                "void proto2_unittest::TestPackedTypesLite::set_packed_enum(int, ::proto2_unittest::ForeignEnumLite)"
               );
}

Assistant:

void TestUtilLite::ModifyPackedFields(unittest::TestPackedTypesLite* message) {
  message->set_packed_int32(1, 801);
  message->set_packed_int64(1, 802);
  message->set_packed_uint32(1, 803);
  message->set_packed_uint64(1, 804);
  message->set_packed_sint32(1, 805);
  message->set_packed_sint64(1, 806);
  message->set_packed_fixed32(1, 807);
  message->set_packed_fixed64(1, 808);
  message->set_packed_sfixed32(1, 809);
  message->set_packed_sfixed64(1, 810);
  message->set_packed_float(1, 811);
  message->set_packed_double(1, 812);
  message->set_packed_bool(1, true);
  message->set_packed_enum(1, unittest::FOREIGN_LITE_FOO);
}